

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u16.c
# Opt level: O0

size_t u16CTZ_fast(u16 w)

{
  size_t local_20;
  u16 t;
  size_t l;
  u16 w_local;
  
  l = 0x10;
  w_local = w;
  if ((u16)(w << 8) != 0) {
    l = 8;
    w_local = w << 8;
  }
  if ((u16)(w_local << 4) != 0) {
    l = l - 4;
    w_local = w_local << 4;
  }
  if ((u16)(w_local << 2) != 0) {
    l = l - 2;
    w_local = w_local << 2;
  }
  if ((w_local & 0x7fff) == 0) {
    local_20 = l - (long)(int)(uint)(w_local != 0);
  }
  else {
    local_20 = l - 2;
  }
  return local_20;
}

Assistant:

size_t FAST(u16CTZ)(register u16 w)
{
	register size_t l = 16;
	register u16 t;
	if (t = w << 8)
		l -= 8, w = t;
	if (t = w << 4)
		l -= 4, w = t;
	if (t = w << 2)
		l -= 2, w = t;
	t = 0;
	return ((u16)(w << 1)) ? l - 2 : l - (w ? 1 : 0);
}